

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
min_function::evaluate
          (min_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  type_conflict9 tVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  size_t sVar7;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *rhs;
  reference pbVar8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar9;
  assertion_error *this_00;
  ulong uVar10;
  size_t i_00;
  size_t i;
  ulong i_01;
  allocator<char> local_51;
  string local_50;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"assertion \'args.size() == *this->arity()\' failed at  <> :0",
               &local_51);
    assertion_error::assertion_error(this_00,&local_50);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ == value) {
    pbVar9 = (ppVar1->field_1).value_;
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(pbVar9);
    if (bVar2) {
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(pbVar9);
      if (bVar2) goto LAB_002ca365;
      pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar9,0);
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(pbVar6);
      pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar9,0);
      bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(pbVar6);
      if (bVar2 || bVar3) {
        i_01 = 1;
        i_00 = 0;
        while( true ) {
          sVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(pbVar9);
          if (sVar7 <= i_01) {
            pbVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                               (pbVar9,i_00);
            return pbVar9;
          }
          pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar9,i_01)
          ;
          bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                            (pbVar6);
          if (bVar2 != bVar4) break;
          pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar9,i_01)
          ;
          bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                            (pbVar6);
          if (bVar3 != bVar4) break;
          pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar9,i_01)
          ;
          rhs = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar9,i_00);
          tVar5 = jsoncons::operator<(pbVar6,rhs);
          uVar10 = i_01;
          if (!tVar5) {
            uVar10 = i_00;
          }
          i_01 = i_01 + 1;
          i_00 = uVar10;
        }
      }
    }
  }
  std::error_code::operator=(ec,invalid_type);
LAB_002ca365:
  pbVar8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar8;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.empty())
                {
                    return context.null_value();
                }

                bool is_number = arg0.at(0).is_number();
                bool is_string = arg0.at(0).is_string();
                if (!is_number && !is_string)
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                std::size_t index = 0;
                for (std::size_t i = 1; i < arg0.size(); ++i)
                {
                    if (!(arg0.at(i).is_number() == is_number && arg0.at(i).is_string() == is_string))
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    if (arg0.at(i) < arg0.at(index))
                    {
                        index = i;
                    }
                }

                return arg0.at(index);
            }